

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::EnumOptions::Clear(EnumOptions *this)

{
  internal::ExtensionSet::Clear(&this->_extensions_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
  if (((this->_has_bits_).has_bits_[0] & 3) != 0) {
    this->allow_alias_ = false;
    this->deprecated_ = false;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void EnumOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.EnumOptions)
  _extensions_.Clear();
  uninterpreted_option_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    ::memset(&allow_alias_, 0, reinterpret_cast<char*>(&deprecated_) -
      reinterpret_cast<char*>(&allow_alias_) + sizeof(deprecated_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}